

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.h
# Opt level: O0

void __thiscall chrono::ChLinkLockRevolute::~ChLinkLockRevolute(ChLinkLockRevolute *this)

{
  void *in_RSI;
  ChLinkLockRevolute *this_local;
  
  ~ChLinkLockRevolute(this);
  ChLinkLock::operator_delete(&this->super_ChLinkLock,in_RSI);
  return;
}

Assistant:

class ChApi ChLinkLockRevolute : public ChLinkLock {
  public:
    ChLinkLockRevolute() { ChangeLinkType(LinkType::REVOLUTE); }

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLinkLockRevolute* Clone() const override { return new ChLinkLockRevolute(*this); }

    /// Lock the joint.
    /// If enabled (lock = true) this effectively converts this joint into a weld joint.
    /// If lock = false, the joint reverts to its original degrees of freedom.
    void Lock(bool lock);
}